

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

int server_write_header(FMContext fmc,int enc_len,uchar *enc_buffer)

{
  int iVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int byte_reversal;
  int byte_reversal_00;
  FMContext fmc_00;
  FMContext fmc_01;
  int magic;
  int server_pid;
  int enc_len_local;
  
  magic = 0x4356ffac;
  enc_len_local = enc_len;
  if (enc_len == 0) {
    put_serverAtomicInt(fmc->server_fd,&magic,(FMContext)enc_buffer);
    put_serverAtomicInt(fmc->server_fd,&enc_len_local,fmc_01);
    iVar1 = extraout_EDX_00;
  }
  else {
    server_pid = enc_len;
    put_serverAtomicInt(fmc->server_fd,&magic,(FMContext)enc_buffer);
    put_serverAtomicInt(fmc->server_fd,&server_pid,fmc_00);
    serverAtomicWrite(fmc->server_fd,enc_buffer,enc_len);
    iVar1 = extraout_EDX;
  }
  get_serverAtomicInt(fmc->server_fd,&magic,iVar1);
  get_serverAtomicInt(fmc->server_fd,&server_pid,byte_reversal);
  get_serverAtomicInt(fmc->server_fd,&fmc->format_server_identifier,byte_reversal_00);
  iVar1 = 0;
  if (fmc->server_pid == server_pid || fmc->server_pid == 0) {
    fmc->server_pid = server_pid;
    if (magic != 0x4356ffa9) {
      if (magic != -0x5600a9bd) {
        return -1;
      }
      fmc->server_byte_reversal = 1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

extern int
server_write_header(FMContext fmc, int enc_len, unsigned char *enc_buffer)
{
    FILE_INT magic = MAGIC_NUMBER + CURRENT_PROTOCOL_VERSION;
    FILE_INT server_pid;
    if (enc_len == 0) {
	put_serverAtomicInt(fmc->server_fd, &magic, fmc);
	put_serverAtomicInt(fmc->server_fd, &enc_len, fmc);
    } else {
	FILE_INT key_len = enc_len;
	put_serverAtomicInt(fmc->server_fd, &magic, fmc);
	put_serverAtomicInt(fmc->server_fd, &key_len, fmc);
	serverAtomicWrite(fmc->server_fd, enc_buffer, key_len);
    }	
    get_serverAtomicInt(fmc->server_fd, &magic, 0);
    get_serverAtomicInt(fmc->server_fd, &server_pid, 0);
    get_serverAtomicInt(fmc->server_fd, &fmc->format_server_identifier, 0);
    if ((fmc->server_pid != 0) && (fmc->server_pid != server_pid)) {
	return 0;
    } else {
	fmc->server_pid = server_pid;
    }
    if (magic != MAGIC_NUMBER) {
	if (magic == REVERSE_MAGIC_NUMBER) {
	    fmc->server_byte_reversal = 1;
	} else {
	    /* close client */
	    return -1;
	}
    }
    return 1;
}